

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O0

decimal128_to_chars_result
jsoncons::bson::decimal128_to_chars(char *first,char *last,decimal128_t *dec)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  long lVar11;
  int *piVar12;
  undefined8 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  uint32_t *in_R8;
  decimal128_to_chars_result dVar13;
  bson_uint128_t value;
  size_t i_3;
  int32_t i_2;
  int32_t radix_position;
  size_t i_1;
  string s;
  size_t i;
  int j;
  uint32_t least_digits;
  int k;
  bson_uint128_t significand128;
  uint8_t significand_msb;
  bool is_zero;
  int32_t scientific_exponent;
  int32_t exponent;
  uint32_t *significand_read;
  uint32_t significand [36];
  uint32_t significand_digits;
  uint32_t biased_exponent;
  uint32_t combination;
  uint32_t low;
  uint32_t midl;
  uint32_t midh;
  uint32_t high;
  char significand_str [35];
  char *str_out;
  uint32_t exponent_bias;
  uint32_t combination_nan;
  uint32_t combination_infinity;
  uint32_t exponent_mask;
  uint32_t combination_mask;
  string bson_decimal128_nan;
  string bson_decimal128_inf;
  allocator<char> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  char *pcVar14;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  int local_208;
  int local_204;
  ulong local_200;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  string local_1e8 [32];
  ulong local_1c8;
  int local_1bc;
  detail *local_1b8;
  undefined8 uStack_1b0;
  bson_uint128_t local_1a8;
  int iStack_198;
  int iStack_194;
  int iStack_190;
  byte local_18a;
  byte local_189;
  int local_188;
  int local_184;
  uint *local_180;
  uint local_178 [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  uint local_e4;
  uint local_e0;
  undefined1 local_c8 [40];
  char *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [32];
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  undefined4 local_8;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8
             ,in_stack_fffffffffffffda0);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8
             ,in_stack_fffffffffffffda0);
  std::allocator<char>::~allocator(&local_81);
  local_88 = 0x1f;
  local_8c = 0x3fff;
  local_90 = 0x1e;
  local_94 = 0x1f;
  local_98 = 0x1820;
  local_a0 = local_18;
  memset(local_178,0,0x90);
  local_180 = local_178;
  local_189 = 0;
  memset(local_c8,0,0x23);
  if ((long)local_28[1] < 0) {
    *local_a0 = '-';
    local_a0 = local_a0 + 1;
  }
  iVar3 = (int)*local_28;
  iVar4 = (int)((ulong)*local_28 >> 0x20);
  iVar5 = (int)local_28[1];
  uVar6 = (uint)((ulong)local_28[1] >> 0x20);
  uVar7 = uVar6 >> 0x1a & 0x1f;
  if (uVar7 >> 3 == 3) {
    if (uVar7 == 0x1e) {
      lVar8 = (long)local_20 - (long)local_a0;
      lVar11 = std::__cxx11::string::size();
      pcVar2 = local_a0;
      if (lVar11 <= lVar8) {
        pvVar9 = (void *)std::__cxx11::string::data();
        sVar10 = std::__cxx11::string::size();
        memcpy(pcVar2,pvVar9,sVar10);
        lVar8 = std::__cxx11::string::size();
        local_a0 = local_a0 + lVar8;
      }
      *local_a0 = '\0';
      local_10 = local_a0;
      local_8 = 0;
      local_1a8.parts[2] = 1;
      goto LAB_001f0c30;
    }
    if (uVar7 == 0x1f) {
      local_a0 = local_18;
      lVar8 = std::__cxx11::string::size();
      pcVar2 = local_a0;
      if (lVar8 <= (long)local_20 - (long)local_18) {
        pvVar9 = (void *)std::__cxx11::string::data();
        sVar10 = std::__cxx11::string::size();
        memcpy(pcVar2,pvVar9,sVar10);
        lVar8 = std::__cxx11::string::size();
        local_a0 = local_a0 + lVar8;
      }
      *local_a0 = '\0';
      local_10 = local_a0;
      local_8 = 0;
      local_1a8.parts[2] = 1;
      goto LAB_001f0c30;
    }
    local_e0 = uVar6 >> 0xf;
    local_18a = ((byte)(uVar6 >> 0xe) & 1) + 8;
  }
  else {
    local_18a = (byte)(uVar6 >> 0xe) & 7;
    local_e0 = uVar6 >> 0x11;
  }
  local_e0 = local_e0 & 0x3fff;
  local_184 = local_e0 - 0x1820;
  local_1a8.parts[3] = (uVar6 & 0x3fff) + (local_18a & 0xf) * 0x4000;
  iStack_198 = iVar5;
  iStack_194 = iVar4;
  iStack_190 = iVar3;
  if ((((local_1a8.parts[3] == 0) && (iVar5 == 0)) && (iVar4 == 0)) && (iVar3 == 0)) {
    local_189 = 1;
  }
  else if (local_1a8.parts[3] < 0x20000) {
    for (local_1a8.parts[1] = 3; -1 < (int)local_1a8.parts[1];
        local_1a8.parts[1] = local_1a8.parts[1] - 1) {
      local_1a8.parts[0] = 0;
      local_1b8 = (detail *)CONCAT44(iStack_198,local_1a8.parts[3]);
      uStack_1b0 = CONCAT44(iStack_190,iStack_194);
      value.parts._8_8_ = local_1a8.parts + 3;
      value.parts[0] = iStack_194;
      value.parts[1] = iStack_190;
      detail::bson_uint128_divide1B(local_1b8,value,&local_1a8,in_R8);
      if (local_1a8.parts[0] != 0) {
        for (local_1bc = 8; -1 < local_1bc; local_1bc = local_1bc + -1) {
          local_178[(int)(local_1a8.parts[1] * 9 + local_1bc)] = local_1a8.parts[0] % 10;
          local_1a8.parts[0] = local_1a8.parts[0] / 10;
        }
      }
    }
  }
  else {
    local_189 = 1;
  }
  if ((local_189 & 1) == 0) {
    local_e4 = 0x24;
    for (; *local_180 == 0; local_180 = local_180 + 1) {
      local_e4 = local_e4 - 1;
    }
  }
  else {
    local_e4 = 1;
    *local_180 = 0;
  }
  local_188 = (local_e4 - 1) + local_184;
  if ((local_188 < -6) || (0 < local_184)) {
    *local_a0 = (char)*local_180 + '0';
    pcVar2 = local_a0 + 1;
    if (local_e4 - 1 != 0) {
      local_a0[1] = '.';
      pcVar2 = local_a0 + 2;
    }
    local_a0 = pcVar2;
    for (local_1c8 = 0; local_180 = local_180 + 1,
        local_1c8 < local_e4 - 1 && (long)local_a0 - (long)local_18 < 0x24;
        local_1c8 = local_1c8 + 1) {
      *local_a0 = (char)*local_180 + '0';
      local_a0 = local_a0 + 1;
    }
    *local_a0 = 'E';
    local_a0 = local_a0 + 1;
    std::__cxx11::string::string(local_1e8);
    if (-1 < local_188) {
      std::__cxx11::string::push_back((char)local_1e8);
    }
    jsoncons::detail::from_integer<int,std::__cxx11::string>
              (in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
    pcVar14 = local_a0;
    lVar8 = std::__cxx11::string::size();
    pcVar2 = local_a0;
    if (local_20 <= pcVar14 + lVar8) {
      local_10 = local_a0;
      local_8 = 0x4b;
    }
    else {
      pvVar9 = (void *)std::__cxx11::string::data();
      sVar10 = std::__cxx11::string::size();
      memcpy(pcVar2,pvVar9,sVar10);
      lVar11 = std::__cxx11::string::size();
      local_a0 = local_a0 + lVar11;
    }
    local_1a8.parts[2] = (uint32_t)(local_20 <= pcVar14 + lVar8);
    std::__cxx11::string::~string(local_1e8);
    if (local_1a8.parts[2] != 0) goto LAB_001f0c30;
  }
  else if (local_184 < 0) {
    local_1f4 = local_e4 + local_184;
    if (local_1f4 < 1) {
      *local_a0 = '0';
      local_a0 = local_a0 + 1;
    }
    else {
      for (local_1f8 = 0; local_1f8 < local_1f4 && local_a0 < local_20; local_1f8 = local_1f8 + 1) {
        *local_a0 = (char)*local_180 + '0';
        local_180 = local_180 + 1;
        local_a0 = local_a0 + 1;
      }
    }
    *local_a0 = '.';
    while( true ) {
      local_a0 = local_a0 + 1;
      if (-1 < local_1f4) break;
      *local_a0 = '0';
      local_1f4 = local_1f4 + 1;
    }
    local_200 = 0;
    local_1f4 = local_1f4 + 1;
    while( true ) {
      uVar1 = local_200;
      local_204 = local_1f4 + -1;
      local_208 = 0;
      piVar12 = std::max<int>(&local_204,&local_208);
      if (local_e4 - *piVar12 <= uVar1 || local_20 <= local_a0) break;
      *local_a0 = (char)*local_180 + '0';
      local_200 = local_200 + 1;
      local_180 = local_180 + 1;
      local_a0 = local_a0 + 1;
    }
  }
  else {
    for (local_1f0 = 0; local_1f0 < local_e4 && (long)local_a0 - (long)local_18 < 0x24;
        local_1f0 = local_1f0 + 1) {
      *local_a0 = (char)*local_180 + '0';
      local_180 = local_180 + 1;
      local_a0 = local_a0 + 1;
    }
  }
  local_10 = local_a0;
  local_8 = 0;
  local_1a8.parts[2] = 1;
LAB_001f0c30:
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  dVar13.ec = local_8;
  dVar13.ptr = local_10;
  dVar13._12_4_ = 0;
  return dVar13;
}

Assistant:

inline
    decimal128_to_chars_result decimal128_to_chars(char* first, char* last, const decimal128_t& dec)
    {
        const std::string bson_decimal128_inf = "Infinity";
        const std::string bson_decimal128_nan = "NaN";

        const uint32_t combination_mask = 0x1f;   /* Extract least significant 5 bits */
        const uint32_t exponent_mask = 0x3fff;    /* Extract least significant 14 bits */
        const uint32_t combination_infinity = 30; /* Value of combination field for Inf */
        const uint32_t combination_nan = 31;      /* Value of combination field for NaN */
        const uint32_t exponent_bias = 6176;      /* decimal128 exponent bias */

        char* str_out = first;      /* output pointer in string */
        char significand_str[35]; /* decoded significand digits */

        /* Note: bits in this routine are referred to starting at 0, */
        /* from the sign bit, towards the coefficient. */
        uint32_t high;                   /* bits 0 - 31 */
        uint32_t midh;                   /* bits 32 - 63 */
        uint32_t midl;                   /* bits 64 - 95 */
        uint32_t low;                    /* bits 96 - 127 */
        uint32_t combination;            /* bits 1 - 5 */
        uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
        uint32_t significand_digits = 0; /* the number of significand digits */
        uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
        uint32_t *significand_read = significand; /* read pointer into significand */
        int32_t exponent;                         /* unbiased exponent */
        int32_t scientific_exponent; /* the exponent if scientific notation is
                                      * used */
        bool is_zero = false;        /* true if the number is zero */
 
        uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
        bson_uint128_t
           significand128; /* temporary storage for significand decoding */
 
        memset (significand_str, 0, sizeof (significand_str));
 
        if ((int64_t) dec.high < 0) { /* negative */
           *(str_out++) = '-';
        }
 
        low = (uint32_t) dec.low, midl = (uint32_t) (dec.low >> 32),
        midh = (uint32_t) dec.high, high = (uint32_t) (dec.high >> 32);
 
        /* Decode combination field and exponent */
        combination = (high >> 26) & combination_mask;
 
        if (JSONCONS_UNLIKELY ((combination >> 3) == 3)) {
           /* Check for 'special' values */
           if (combination == combination_infinity) { /* Infinity */
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_inf.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_inf.data(), bson_decimal128_inf.size());
                   str_out += bson_decimal128_inf.size();
               }
               *str_out = 0;
              //strcpy_s (str_out, last-str_out, bson_decimal128_inf.c_str());
              return decimal128_to_chars_result{str_out, std::errc()};
           } else if (combination == combination_nan) { /* NaN */
               /* first, not str_out, to erase the sign */
               str_out = first;
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_nan.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_nan.data(), bson_decimal128_nan.size());
                   str_out += bson_decimal128_nan.size();
               }
               *str_out = 0;
              //strcpy_s (first, last-first, bson_decimal128_nan.c_str());
              /* we don't care about the NaN payload. */
               return decimal128_to_chars_result{str_out, std::errc()};
           } else {
              biased_exponent = (high >> 15) & exponent_mask;
              significand_msb = 0x8 + ((high >> 14) & 0x1);
           }
        } else {
           significand_msb = (high >> 14) & 0x7;
           biased_exponent = (high >> 17) & exponent_mask;
        }
 
        exponent = biased_exponent - exponent_bias;
        /* Create string of significand digits */
 
        /* Convert the 114-bit binary number represented by */
        /* (high, midh, midl, low) to at most 34 decimal */
        /* digits through modulo and division. */
        significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
        significand128.parts[1] = midh;
        significand128.parts[2] = midl;
        significand128.parts[3] = low;
 
        if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
            significand128.parts[2] == 0 && significand128.parts[3] == 0) {
           is_zero = true;
        } else if (significand128.parts[0] >= (1 << 17)) {
           /* The significand is non-canonical or zero.
            * In order to preserve compatibility with the densely packed decimal
            * format, the maximum value for the significand of decimal128 is
            * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
            * standard dictates that the significand is interpreted as zero.
            */
           is_zero = true;
        } else {
           for (int k = 3; k >= 0; k--) {
              uint32_t least_digits = 0;
              detail::bson_uint128_divide1B (
                 significand128, &significand128, &least_digits);
 
              /* We now have the 9 least significant digits (in base 2). */
              /* Convert and output to string. */
              if (!least_digits) {
                 continue;
              }
 
              for (int j = 8; j >= 0; j--) {
                 significand[k * 9 + j] = least_digits % 10;
                 least_digits /= 10;
              }
           }
        }
 
        /* Output format options: */
        /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
        /* Regular    - ddd.ddd */
 
        if (is_zero) {
           significand_digits = 1;
           *significand_read = 0;
        } else {
           significand_digits = 36;
           while (!(*significand_read)) {
              significand_digits--;
              significand_read++;
           }
        }
 
        scientific_exponent = significand_digits - 1 + exponent;
 
        /* The scientific exponent checks are dictated by the string conversion
         * specification and are somewhat arbitrary cutoffs.
         *
         * We must check exponent > 0, because if this is the case, the number
         * has trailing zeros.  However, we *cannot* output these trailing zeros,
         * because doing so would change the precision of the value, and would
         * change stored data if the string converted number is round tripped.
         */
        if (scientific_exponent < -6 || exponent > 0) {
           /* Scientific format */
           *(str_out++) = char(*(significand_read++)) + '0';
           significand_digits--;
 
           if (significand_digits) {
              *(str_out++) = '.';
           }
 
           for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
              *(str_out++) = char(*(significand_read++)) + '0';
           }
           /* Exponent */
           *(str_out++) = 'E';

           std::string s;
           if (scientific_exponent >= 0) {
               s.push_back('+');
           }
           jsoncons::detail::from_integer(scientific_exponent, s);
           if (str_out + s.size() < last) 
           {
               std::memcpy(str_out, s.data(), s.size());
           }
           else
           {
               return decimal128_to_chars_result{str_out, std::errc::value_too_large};
           }
           str_out += s.size();
        } else {
           /* Regular format with no decimal place */
           if (exponent >= 0) {
              for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           } else {
              int32_t radix_position = significand_digits + exponent;
 
              if (radix_position > 0) { /* non-zero digits before radix */
                 for (int32_t i = 0;
                      i < radix_position && (str_out < last);
                      i++) {
                    *(str_out++) = char(*(significand_read++)) + '0';
                 }
              } else { /* leading zero before radix point */
                 *(str_out++) = '0';
              }
 
              *(str_out++) = '.';
              while (radix_position++ < 0) { /* add leading zeros after radix */
                 *(str_out++) = '0';
              }
 
              for (std::size_t i = 0;
                   (i < significand_digits - (std::max) (radix_position - 1, 0)) &&
                   (str_out < last);
                   i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           }
        }
        return decimal128_to_chars_result{str_out, std::errc()};
    }